

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O2

void __thiscall GraphEdit::GraphEdit(GraphEdit *this,GraphModel *model,QWidget *parent)

{
  QWidget *this_00;
  undefined4 *puVar1;
  QRect QVar2;
  ulong uVar3;
  code *local_40;
  undefined8 uStack_38;
  QObject local_30 [8];
  Connection local_28 [8];
  
  QAbstractScrollArea::QAbstractScrollArea(&this->super_QAbstractScrollArea,parent);
  *(undefined ***)this = &PTR_metaObject_001f4180;
  *(undefined ***)&this->field_0x10 = &PTR__GraphEdit_001f4358;
  this->mModel = model;
  this->mMode = WaveformView;
  (this->mPlotRect).x1 = 0;
  (this->mPlotRect).y1 = 0;
  (this->mPlotRect).x2 = -1;
  (this->mPlotRect).y2 = -1;
  this->mBarMode = false;
  this->mLines = true;
  (this->mMouseOver).super__Optional_base<QPoint,_true,_true>._M_payload.
  super__Optional_payload_base<QPoint>._M_engaged = false;
  (this->mLastMouseCoords).xp = 0;
  (this->mLastMouseCoords).yp = 0;
  (this->mBackgroundColor).cspec = Invalid;
  this->mAlternateInterval = 0;
  this->mMinValue = 0;
  this->mMaxValue = 0;
  this->mCellWidth = 0;
  this->mCellHeight = 0;
  (this->mBackgroundColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->mBackgroundColor).ct + 2) = 0;
  (this->mAlternateColor).cspec = Invalid;
  (this->mAlternateColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->mAlternateColor).ct + 2) = 0;
  (this->mLineColor).cspec = Invalid;
  (this->mLineColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->mLineColor).ct + 2) = 0;
  (this->mSampleColor).cspec = Invalid;
  (this->mSampleColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->mSampleColor).ct + 2) = 0;
  this_00 = (QWidget *)QAbstractScrollArea::viewport();
  QWidget::setMouseTracking(this_00,true);
  QVar2 = QWidget::rect(this_00);
  this->mPlotRect = QVar2;
  QRect::adjust(&this->mPlotRect,8,8,-8,-8);
  local_40 = QWidget::update;
  uStack_38 = 0;
  uVar3 = 0;
  QObject::connect<void(GraphModel::*)(),void(QWidget::*)()>
            ((Object *)local_28,(offset_in_GraphModel_to_subr)model,
             (Object *)GraphModel::dataChanged,0,(ConnectionType)this_00);
  QMetaObject::Connection::~Connection(local_28);
  local_40 = GraphModel::countChanged;
  uStack_38 = 0;
  puVar1 = (undefined4 *)operator_new(0x18);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/widgets/GraphEdit.cpp:96:9),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(GraphEdit **)(puVar1 + 4) = this;
  QObject::connectImpl
            (local_30,(void **)model,(QObject *)&local_40,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar1,(int *)(uVar3 & 0xffffffff00000000),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  calculateAxis(this);
  setViewModeImpl(this,this->mMode);
  return;
}

Assistant:

GraphEdit::GraphEdit(GraphModel &model, QWidget *parent) :
    QAbstractScrollArea(parent),
    mModel(model),
    mMode(GraphEdit::WaveformView),
    mBarMode(false),
    mLines(true),
    mMinValue(0),
    mMaxValue(0),
    mCellWidth(0),
    mCellHeight(0),
    mAlternateInterval(0),
    mMouseOver()
{
    auto _viewport = viewport();
    _viewport->setMouseTracking(true);
    mPlotRect = _viewport->rect();
    mPlotRect.adjust(TU::PADDING_X, TU::PADDING_Y, -TU::PADDING_X, -TU::PADDING_Y);

    connect(&model, &GraphModel::dataChanged, _viewport, qOverload<>(&QWidget::update));
    connect(&model, &GraphModel::countChanged, this,
        [this](int count) {
            Q_UNUSED(count)
            calculateCellWidth();
            viewport()->update();
        });

    calculateAxis();
    setViewModeImpl(mMode);
}